

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O1

ShaderMacroArray Diligent::GetShaderTypeMacros(SHADER_TYPE Type)

{
  undefined1 *puVar1;
  ulong uVar2;
  ShaderMacroArray SVar3;
  string msg;
  string local_28;
  
  uVar2 = (ulong)Type;
  if ((int)Type < 0x100) {
    if ((int)Type < 0x10) {
      switch(Type) {
      case SHADER_TYPE_VERTEX:
        puVar1 = (anonymous_namespace)::VSMacros;
        break;
      case SHADER_TYPE_PIXEL:
        puVar1 = (anonymous_namespace)::PSMacros;
        break;
      default:
        goto switchD_0029c7c4_caseD_3;
      case SHADER_TYPE_GEOMETRY:
        puVar1 = (anonymous_namespace)::GSMacros;
        goto LAB_0029c90d;
      case SHADER_TYPE_HULL:
        puVar1 = (anonymous_namespace)::HSMacros;
        goto LAB_0029c8ff;
      }
      goto LAB_0029c912;
    }
    if ((int)Type < 0x40) {
      if (Type == SHADER_TYPE_DOMAIN) {
        puVar1 = (anonymous_namespace)::DSMacros;
LAB_0029c8ff:
        uVar2 = 2;
        goto LAB_0029c912;
      }
      if (Type == SHADER_TYPE_COMPUTE) {
        puVar1 = (anonymous_namespace)::CSMacros;
        goto LAB_0029c90d;
      }
    }
    else {
      if (Type == SHADER_TYPE_AMPLIFICATION) {
        puVar1 = (anonymous_namespace)::ASMacros;
        goto LAB_0029c8ff;
      }
      if (Type == SHADER_TYPE_MESH) {
        puVar1 = (anonymous_namespace)::MSMacros;
        goto LAB_0029c90d;
      }
    }
switchD_0029c7c4_caseD_3:
    FormatString<char[23]>(&local_28,(char (*) [23])"Unexpected shader type");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetShaderTypeMacros",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
               ,0x5c);
LAB_0029c947:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    uVar2 = 0;
    puVar1 = (undefined1 *)0x0;
  }
  else {
    if ((int)Type < 0x800) {
      if (Type == SHADER_TYPE_RAY_GEN) {
        puVar1 = (anonymous_namespace)::RGMacros;
      }
      else if (Type == SHADER_TYPE_RAY_MISS) {
        puVar1 = (anonymous_namespace)::RMMacros;
      }
      else {
        if (Type != SHADER_TYPE_RAY_CLOSEST_HIT) goto switchD_0029c7c4_caseD_3;
        puVar1 = (anonymous_namespace)::RCHMacros;
      }
    }
    else if ((int)Type < 0x2000) {
      if (Type == SHADER_TYPE_RAY_ANY_HIT) {
        puVar1 = (anonymous_namespace)::RAHMacros;
      }
      else {
        if (Type != SHADER_TYPE_RAY_INTERSECTION) goto switchD_0029c7c4_caseD_3;
        puVar1 = (anonymous_namespace)::RIMacros;
      }
    }
    else {
      if (Type != SHADER_TYPE_CALLABLE) {
        if (Type != SHADER_TYPE_LAST) goto switchD_0029c7c4_caseD_3;
        FormatString<char[24]>(&local_28,(char (*) [24])"Unsupported shader type");
        DebugAssertionFailed
                  (local_28._M_dataplus._M_p,"GetShaderTypeMacros",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
                   ,0x59);
        goto LAB_0029c947;
      }
      puVar1 = (anonymous_namespace)::RCMacros;
    }
LAB_0029c90d:
    uVar2 = 1;
  }
LAB_0029c912:
  SVar3._8_8_ = uVar2;
  SVar3.Elements = (ShaderMacro *)puVar1;
  return SVar3;
}

Assistant:

ShaderMacroArray GetShaderTypeMacros(SHADER_TYPE Type)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please update the switch below to handle the new shader type");
    switch (Type)
    {
        // clang-format off
        case SHADER_TYPE_VERTEX:           return SHADER_MACROS_ARRAY(VSMacros);
        case SHADER_TYPE_PIXEL:            return SHADER_MACROS_ARRAY(PSMacros);
        case SHADER_TYPE_GEOMETRY:         return SHADER_MACROS_ARRAY(GSMacros);
        case SHADER_TYPE_HULL:             return SHADER_MACROS_ARRAY(HSMacros);
        case SHADER_TYPE_DOMAIN:           return SHADER_MACROS_ARRAY(DSMacros);
        case SHADER_TYPE_COMPUTE:          return SHADER_MACROS_ARRAY(CSMacros);
        case SHADER_TYPE_AMPLIFICATION:    return SHADER_MACROS_ARRAY(ASMacros);
        case SHADER_TYPE_MESH:             return SHADER_MACROS_ARRAY(MSMacros);
        case SHADER_TYPE_RAY_GEN:          return SHADER_MACROS_ARRAY(RGMacros);
        case SHADER_TYPE_RAY_MISS:         return SHADER_MACROS_ARRAY(RMMacros);
        case SHADER_TYPE_RAY_CLOSEST_HIT:  return SHADER_MACROS_ARRAY(RCHMacros);
        case SHADER_TYPE_RAY_ANY_HIT:      return SHADER_MACROS_ARRAY(RAHMacros);
        case SHADER_TYPE_RAY_INTERSECTION: return SHADER_MACROS_ARRAY(RIMacros);
        case SHADER_TYPE_CALLABLE:         return SHADER_MACROS_ARRAY(RCMacros);
        // clang-format on
        case SHADER_TYPE_TILE:
            UNEXPECTED("Unsupported shader type");
            return ShaderMacroArray{};
        default:
            UNEXPECTED("Unexpected shader type");
            return ShaderMacroArray{};
    }
}